

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.h
# Opt level: O2

void dmlc::serializer::NativePODStringHandler<char>::Write
               (Stream *strm,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *vec)

{
  uint64_t sz;
  
  sz = vec->_M_string_length;
  (*strm->_vptr_Stream[1])(strm,&sz,8);
  if (sz != 0) {
    (*strm->_vptr_Stream[1])(strm,(vec->_M_dataplus)._M_p,vec->_M_string_length);
  }
  return;
}

Assistant:

inline static void Write(Stream *strm, const std::basic_string<T> &vec) {
    uint64_t sz = static_cast<uint64_t>(vec.length());
    strm->Write<uint64_t>(sz);
    if (sz != 0) {
      strm->Write(&vec[0], sizeof(T) * vec.length());
    }
  }